

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_stress_test.cpp
# Opt level: O1

void __thiscall
density_tests::allocator_stress_test::Impl::run(Impl *this,ThreadData *i_data,uint64_t i_cpu_index)

{
  mutex *__mutex;
  double dVar1;
  bool bVar2;
  int iVar3;
  microseconds mVar4;
  int *piVar5;
  long lVar6;
  void *pvVar7;
  size_t index;
  ulong uVar8;
  long *in_FS_OFFSET;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  void *new_page;
  page_warehouse warehouse;
  EasyRandom rand;
  timespec local_1428;
  page_warehouse local_1418;
  PageAllocator<density::detail::SystemPageManager<65536UL>_> *local_13e8;
  Impl *local_13e0;
  long local_13d8;
  ulong local_13d0;
  long local_13c8;
  EasyRandom local_13c0;
  
  set_thread_affinity(1L << ((byte)i_cpu_index & 0x3f));
  set_thread_priority(critical);
  EasyRandom::EasyRandom(&local_13c0);
  local_1418.m_timeout.__r = (this->m_config).m_allocation_timeout.__r * 1000;
  local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (void **)0x0;
  local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (void **)0x0;
  local_1418.m_max_pages = (this->m_config).m_max_memory_per_cpu / 0xfff0;
  __mutex = &(this->m_started_threads).m_mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  (this->m_started_threads).m_counter = (this->m_started_threads).m_counter + 1;
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (((this->m_should_exit)._M_base._M_i & 1U) == 0) {
    local_13e8 = (PageAllocator<density::detail::SystemPageManager<65536UL>_> *)
                 (*in_FS_OFFSET + -0xc0);
    uVar8 = 0;
    local_13e0 = this;
    do {
      mVar4 = random_duration(&local_13c0,(local_13e0->m_config).m_min_wait.__r,
                              (local_13e0->m_config).m_max_wait.__r);
      dVar9 = (double)mVar4.__r * 1e-06;
      dVar1 = (i_data->m_inactivity_time).m_average;
      dVar11 = (i_data->m_inactivity_time).m_min;
      dVar13 = dVar9;
      if (dVar11 <= dVar9) {
        dVar13 = dVar11;
      }
      (i_data->m_inactivity_time).m_min = dVar13;
      dVar11 = (i_data->m_inactivity_time).m_max;
      dVar13 = dVar9;
      if (dVar9 <= dVar11) {
        dVar13 = dVar11;
      }
      dVar11 = (i_data->m_inactivity_time).m_count + 1.0;
      (i_data->m_inactivity_time).m_max = dVar13;
      (i_data->m_inactivity_time).m_average = (dVar9 - dVar1) / dVar11 + dVar1;
      (i_data->m_inactivity_time).m_count = dVar11;
      (i_data->m_inactivity_time).m_sum = dVar9 + (i_data->m_inactivity_time).m_sum;
      if (0 < mVar4.__r) {
        local_1428.tv_sec = (ulong)mVar4.__r / 1000000;
        local_1428.tv_nsec = ((ulong)mVar4.__r % 1000000) * 1000;
        do {
          iVar3 = nanosleep(&local_1428,&local_1428);
          if (iVar3 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
      }
      local_13d8 = std::chrono::_V2::steady_clock::now();
      local_13d0 = uVar8;
      if ((uVar8 & 1) == 0) {
        local_13c8 = std::chrono::_V2::steady_clock::now();
        bVar2 = false;
        while( true ) {
          if (bVar2) {
            density::detail::PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance
            ::__tls_init();
            pvVar7 = density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
                     try_allocate_page<(density::detail::page_allocation_type)0>
                               (local_13e8,progress_blocking);
          }
          else {
            density::detail::PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance
            ::__tls_init();
            pvVar7 = density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
                     try_allocate_page<(density::detail::page_allocation_type)1>
                               (local_13e8,progress_blocking);
          }
          local_1428.tv_sec = (__time_t)pvVar7;
          if (pvVar7 == (void *)0x0) break;
          lVar6 = 0;
          do {
            if ((!bVar2) && (*(long *)((long)pvVar7 + lVar6 * 8) != 0)) {
              detail::assert_failed<>
                        ("words[index] == 0",
                         "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/test_framework/allocator_stress_test.cpp"
                         ,0x5a);
            }
            *(__time_t *)((long)pvVar7 + lVar6 * 8) = local_1428.tv_sec;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x1ffe);
          if (local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                      ((vector<void*,std::allocator<void*>> *)&local_1418,
                       (iterator)
                       local_1418.m_allocated_pages.
                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,(void **)&local_1428);
          }
          else {
            *local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish = (void *)local_1428.tv_sec;
            local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
            .super__Vector_impl_data._M_finish =
                 local_1418.m_allocated_pages.super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (((pvVar7 == (void *)0x0) ||
              (lVar6 = std::chrono::_V2::steady_clock::now(),
              local_1418.m_timeout.__r <= lVar6 - local_13c8)) ||
             (bVar2 = (bool)(bVar2 ^ 1),
             local_1418.m_max_pages <=
             (ulong)((long)local_1418.m_allocated_pages.
                           super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_1418.m_allocated_pages.
                           super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3))) break;
        }
      }
      else {
        lVar6 = ((ulong)((long)local_1418.m_allocated_pages.
                               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_1418.m_allocated_pages.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * 0xfff0;
        auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar10._0_8_ = lVar6;
        auVar10._12_4_ = 0x45300000;
        dVar9 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) *
                9.5367431640625e-07;
        dVar1 = (i_data->m_used_memory).m_average;
        dVar12 = (i_data->m_used_memory).m_count + 1.0;
        dVar11 = (i_data->m_used_memory).m_min;
        dVar13 = dVar9;
        if (dVar11 <= dVar9) {
          dVar13 = dVar11;
        }
        (i_data->m_used_memory).m_min = dVar13;
        dVar11 = (i_data->m_used_memory).m_max;
        dVar13 = dVar9;
        if (dVar9 <= dVar11) {
          dVar13 = dVar11;
        }
        (i_data->m_used_memory).m_max = dVar13;
        (i_data->m_used_memory).m_average = (dVar9 - dVar1) / dVar12 + dVar1;
        (i_data->m_used_memory).m_count = dVar12;
        (i_data->m_used_memory).m_sum = dVar9 + (i_data->m_used_memory).m_sum;
        anon_unknown_5::page_warehouse::deallocation_loop(&local_1418);
      }
      uVar8 = local_13d0 ^ 1;
      lVar6 = std::chrono::_V2::steady_clock::now();
      dVar9 = (double)(lVar6 - local_13d8) * 1e-09;
      dVar1 = (i_data->m_activity_time).m_average;
      dVar12 = (i_data->m_activity_time).m_count + 1.0;
      dVar11 = (i_data->m_activity_time).m_min;
      dVar13 = dVar9;
      if (dVar11 <= dVar9) {
        dVar13 = dVar11;
      }
      (i_data->m_activity_time).m_min = dVar13;
      dVar11 = (i_data->m_activity_time).m_max;
      dVar13 = dVar9;
      if (dVar9 <= dVar11) {
        dVar13 = dVar11;
      }
      (i_data->m_activity_time).m_max = dVar13;
      (i_data->m_activity_time).m_average = (dVar9 - dVar1) / dVar12 + dVar1;
      (i_data->m_activity_time).m_count = dVar12;
      (i_data->m_activity_time).m_sum = dVar9 + (i_data->m_activity_time).m_sum;
    } while (((local_13e0->m_should_exit)._M_base._M_i & 1U) == 0);
  }
  anon_unknown_5::page_warehouse::~page_warehouse(&local_1418);
  return;
}

Assistant:

void run(ThreadData & i_data, uint64_t i_cpu_index)
        {
            set_thread_affinity(uint64_t(1) << i_cpu_index);
            set_thread_priority(thread_priority::critical);
            EasyRandom rand;

            page_warehouse warehouse(m_config.m_max_memory_per_cpu, m_config.m_allocation_timeout);

            m_started_threads.increment();

            auto micro_to_seconds = [](std::chrono::microseconds i_microseconds) {
                double const mult = 1. / (1000. * 1000.);
                return static_cast<double>(i_microseconds.count()) * mult;
            };

            auto nano_to_seconds = [](std::chrono::nanoseconds i_nanoseconds) {
                double const mult = 1. / (1000. * 1000. * 1000.);
                return static_cast<double>(i_nanoseconds.count()) * mult;
            };

            bool should_allocate = false;
            while (!m_should_exit.load())
            {
                auto const wait_duration =
                  random_duration(rand, m_config.m_min_wait, m_config.m_max_wait);

                i_data.m_inactivity_time.sample(micro_to_seconds(wait_duration));

                std::this_thread::sleep_for(wait_duration);

                auto const activity_start = std::chrono::steady_clock::now();

                should_allocate = !should_allocate;
                if (should_allocate)
                {
                    warehouse.allocation_loop();
                }
                else
                {
                    double const bytes_to_mb = 1. / (1024. * 1024.);
                    i_data.m_used_memory.sample(warehouse.allocated_memory() * bytes_to_mb);
                    warehouse.deallocation_loop();
                }

                auto const activity_duration = std::chrono::steady_clock::now() - activity_start;

                i_data.m_activity_time.sample(nano_to_seconds(activity_duration));
            }
        }